

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-chat.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  pointer plVar1;
  _Alloc_hider _Var2;
  undefined1 uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  llama_chat_message *msg;
  pointer plVar12;
  char *pcVar13;
  llama_model_params *plVar14;
  llama_context_params *plVar15;
  int32_t *piVar16;
  int iVar17;
  byte bVar18;
  int32_t local_3f8 [2];
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  int8_t *local_3c8;
  int local_37c;
  undefined8 local_378;
  uint local_370;
  llama_token new_token_id;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> messages;
  vector<char,_std::allocator<char>_> formatted;
  string user;
  vector<int,_std::allocator<int>_> prompt_tokens;
  string prompt;
  string response;
  string model_path;
  llama_batch batch;
  string piece;
  llama_batch local_230;
  char buf [256];
  llama_context_params ctx_params;
  llama_model_params model_params;
  
  bVar18 = 0;
  model_path._M_dataplus._M_p = (pointer)&model_path.field_2;
  model_path._M_string_length = 0;
  model_path.field_2._M_local_buf[0] = '\0';
  iVar5 = 99;
  local_378 = CONCAT44(local_378._4_4_,0x800);
  pcVar13 = (char *)argv;
  for (iVar17 = 1; iVar17 < argc; iVar17 = iVar17 + 2) {
    __s1 = argv[iVar17];
    if (*__s1 == '-') {
      if ((__s1[1] != 'm') || (__s1[2] != '\0')) {
        if ((__s1[1] != 'c') || (__s1[2] != '\0')) goto LAB_001035b2;
        if (iVar17 + 1 < argc) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)buf,argv[iVar17 + 1],(allocator<char> *)&ctx_params);
          pcVar13 = (char *)0x0;
          iVar6 = std::__cxx11::stoi((string *)buf,(size_t *)0x0,10);
          local_378 = CONCAT44(local_378._4_4_,iVar6);
          goto LAB_001035f8;
        }
        goto LAB_00103c85;
      }
      if (argc <= iVar17 + 1) goto LAB_00103c85;
      pcVar13 = argv[iVar17 + 1];
      std::__cxx11::string::assign((char *)&model_path);
    }
    else {
LAB_001035b2:
      pcVar13 = "-ngl";
      iVar5 = strcmp(__s1,"-ngl");
      if ((iVar5 != 0) || (argc <= iVar17 + 1)) goto LAB_00103c85;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buf,argv[iVar17 + 1],(allocator<char> *)&ctx_params);
      pcVar13 = (char *)0x0;
      iVar5 = std::__cxx11::stoi((string *)buf,(size_t *)0x0,10);
LAB_001035f8:
      std::__cxx11::string::~string((string *)buf);
    }
  }
  if (model_path._M_string_length == 0) {
LAB_00103c85:
    print_usage((int)argv,(char **)pcVar13);
  }
  else {
    llama_log_set(main::anon_class_1_0_00000001::__invoke,0);
    ggml_backend_load_all();
    llama_model_default_params(&model_params);
    _Var2 = model_path._M_dataplus;
    model_params.n_gpu_layers = iVar5;
    plVar14 = &model_params;
    piVar16 = local_3f8;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(ggml_backend_dev_t **)piVar16 = plVar14->devices;
      plVar14 = (llama_model_params *)((long)plVar14 + (ulong)bVar18 * -0x10 + 8);
      piVar16 = (int32_t *)((long)piVar16 + ((ulong)bVar18 * -2 + 1) * 8);
    }
    lVar10 = llama_model_load_from_file(_Var2._M_p);
    if (lVar10 == 0) {
      pcVar13 = "%s: error: unable to load model\n";
    }
    else {
      uVar8 = llama_model_get_vocab(lVar10);
      llama_context_default_params(&ctx_params);
      ctx_params.n_ctx = (uint32_t)local_378;
      ctx_params.n_batch = (uint32_t)local_378;
      plVar15 = &ctx_params;
      piVar16 = local_3f8;
      for (lVar11 = 0xf; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined8 *)piVar16 = *(undefined8 *)plVar15;
        plVar15 = (llama_context_params *)((long)plVar15 + (ulong)bVar18 * -0x10 + 8);
        piVar16 = (int32_t *)((long)piVar16 + ((ulong)bVar18 * -2 + 1) * 8);
      }
      lVar11 = llama_init_from_model(lVar10);
      if (lVar11 != 0) {
        uVar3 = llama_sampler_chain_default_params();
        local_378 = llama_sampler_chain_init(uVar3);
        uVar9 = llama_sampler_init_min_p(0x3d4ccccd,1);
        llama_sampler_chain_add(local_378,uVar9);
        uVar9 = llama_sampler_init_temp(0x3f4ccccd);
        llama_sampler_chain_add(local_378,uVar9);
        uVar9 = llama_sampler_init_dist(0xffffffffffffffff);
        llama_sampler_chain_add(local_378,uVar9);
        messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = llama_n_ctx(lVar11);
        std::vector<char,_std::allocator<char>_>::vector
                  (&formatted,(ulong)uVar7,(allocator_type *)buf);
        local_370 = 0;
        local_37c = 0;
LAB_001037d2:
        printf("\x1b[32m> \x1b[0m");
        user._M_dataplus._M_p = (pointer)&user.field_2;
        user._M_string_length = 0;
        user.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&user);
        if (user._M_string_length == 0) {
          std::__cxx11::string::~string((string *)&user);
          plVar1 = messages.
                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (plVar12 = messages.
                         super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                         ._M_impl.super__Vector_impl_data._M_start; plVar12 != plVar1;
              plVar12 = plVar12 + 1) {
            free(plVar12->content);
          }
          llama_sampler_free(local_378);
          llama_free(lVar11);
          local_37c = 0;
          llama_model_free(lVar10);
        }
        else {
          uVar9 = llama_model_chat_template(lVar10,0);
          buf._0_8_ = anon_var_dwarf_4adb;
          buf._8_8_ = strdup(user._M_dataplus._M_p);
          std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
          emplace_back<llama_chat_message>(&messages,(llama_chat_message *)buf);
          uVar7 = llama_chat_apply_template
                            (uVar9,messages.
                                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                             (long)messages.
                                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)messages.
                                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4,1,
                             CONCAT44(formatted.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)formatted.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start),
                             (int)formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                             (int)formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if ((int)formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start < (int)uVar7) {
            std::vector<char,_std::allocator<char>_>::resize(&formatted,(long)(int)uVar7);
            uVar7 = llama_chat_apply_template
                              (uVar9,messages.
                                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (long)messages.
                                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)messages.
                                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4,1,
                               CONCAT44(formatted.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)formatted.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start),
                               (int)formatted.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                               (int)formatted.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          }
          if (-1 < (int)uVar7) {
            prompt._M_dataplus._M_p = (pointer)&prompt.field_2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((string *)&prompt,
                       (ulong)local_370 +
                       CONCAT44(formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)formatted.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start),
                       (ulong)uVar7 +
                       CONCAT44(formatted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)formatted.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            printf("\x1b[33m");
            response._M_dataplus._M_p = (pointer)&response.field_2;
            response._M_string_length = 0;
            response.field_2._M_local_buf[0] = '\0';
            iVar5 = llama_kv_self_used_cells(lVar11);
            local_3f8[0] = 1;
            iVar17 = llama_tokenize(uVar8,prompt._M_dataplus._M_p,
                                    (undefined4)prompt._M_string_length,0,0,iVar5 == 0);
            std::vector<int,_std::allocator<int>_>::vector
                      (&prompt_tokens,(long)-iVar17,(allocator_type *)buf);
            local_3f8[0] = 1;
            iVar5 = llama_tokenize(uVar8,prompt._M_dataplus._M_p,(undefined4)prompt._M_string_length
                                   ,prompt_tokens.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                   (ulong)((long)prompt_tokens.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)prompt_tokens.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2,
                                   iVar5 == 0);
            if (iVar5 < 0) {
LAB_00103df9:
              uVar8 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                                 ,0x6b,"failed to tokenize the prompt\n");
              std::_Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>::
              ~_Vector_base(&messages.
                             super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                           );
              std::__cxx11::string::~string((string *)&model_path);
              _Unwind_Resume(uVar8);
            }
            llama_batch_get_one(&batch,prompt_tokens.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)prompt_tokens.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)prompt_tokens.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2);
            do {
              iVar5 = llama_n_ctx(lVar11);
              iVar17 = llama_kv_self_used_cells(lVar11);
              if (iVar5 < iVar17 + batch.n_tokens) {
LAB_00103db0:
                puts("\x1b[0m");
                fwrite("context size exceeded\n",0x16,1,_stderr);
                exit(0);
              }
              local_3c8 = batch.logits;
              local_3d8 = batch.n_seq_id._0_4_;
              uStack_3d4 = batch.n_seq_id._4_4_;
              uStack_3d0 = batch.seq_id._0_4_;
              uStack_3cc = batch.seq_id._4_4_;
              local_3e8 = batch.embd._0_4_;
              uStack_3e4 = batch.embd._4_4_;
              uStack_3e0 = batch.pos._0_4_;
              uStack_3dc = batch.pos._4_4_;
              local_3f8[0] = batch.n_tokens;
              local_3f8[1] = batch._4_4_;
              uStack_3f0 = batch.token._0_4_;
              uStack_3ec = batch.token._4_4_;
              iVar5 = llama_decode(lVar11);
              if (iVar5 != 0) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                           ,0x7c,"failed to decode\n");
                goto LAB_00103db0;
              }
              new_token_id = llama_sampler_sample(local_378,lVar11,0xffffffffffffffff);
              cVar4 = llama_vocab_is_eog(uVar8,new_token_id);
              if (cVar4 != '\0') goto LAB_00103b9f;
              uVar7 = llama_token_to_piece(uVar8,new_token_id,(llama_chat_message *)buf,0x100);
              if ((int)uVar7 < 0) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                           ,0x8b,"failed to convert token to piece\n");
                goto LAB_00103df9;
              }
              piece._M_dataplus._M_p = (pointer)&piece.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&piece,(llama_chat_message *)buf,buf + uVar7);
              printf("%s",piece._M_dataplus._M_p);
              fflush(_stdout);
              std::__cxx11::string::append((string *)&response);
              llama_batch_get_one(&local_230,&new_token_id,1);
              batch.logits = local_230.logits;
              batch.n_seq_id = local_230.n_seq_id;
              batch.seq_id = local_230.seq_id;
              batch.embd = local_230.embd;
              batch.pos = local_230.pos;
              batch.n_tokens = local_230.n_tokens;
              batch._4_4_ = local_230._4_4_;
              batch.token = local_230.token;
              std::__cxx11::string::~string((string *)&piece);
            } while( true );
          }
          fwrite("failed to apply the chat template\n",0x22,1,_stderr);
          std::__cxx11::string::~string((string *)&user);
          local_37c = 1;
        }
        goto LAB_00103ced;
      }
      pcVar13 = "%s: error: failed to create the llama_context\n";
    }
    fprintf(_stderr,pcVar13,"main");
  }
  iVar5 = 1;
LAB_00103d0b:
  std::__cxx11::string::~string((string *)&model_path);
  return iVar5;
LAB_00103b9f:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prompt_tokens.super__Vector_base<int,_std::allocator<int>_>);
  printf("\n\x1b[0m");
  buf._0_8_ = anon_var_dwarf_4b1b;
  buf._8_8_ = strdup(response._M_dataplus._M_p);
  std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
  emplace_back<llama_chat_message>(&messages,(llama_chat_message *)buf);
  local_370 = llama_chat_apply_template
                        (uVar9,messages.
                               super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                         (long)messages.
                               super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)messages.
                               super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4,0,0,0);
  if ((int)local_370 < 0) {
    fwrite("failed to apply the chat template\n",0x22,1,_stderr);
    local_37c = 1;
  }
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::string::~string((string *)&prompt);
  std::__cxx11::string::~string((string *)&user);
  if ((int)local_370 < 0) goto LAB_00103ced;
  goto LAB_001037d2;
LAB_00103ced:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&formatted.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>::~_Vector_base
            (&messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>);
  iVar5 = local_37c;
  goto LAB_00103d0b;
}

Assistant:

int main(int argc, char ** argv) {
    std::string model_path;
    int ngl = 99;
    int n_ctx = 2048;

    // parse command line arguments
    for (int i = 1; i < argc; i++) {
        try {
            if (strcmp(argv[i], "-m") == 0) {
                if (i + 1 < argc) {
                    model_path = argv[++i];
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-c") == 0) {
                if (i + 1 < argc) {
                    n_ctx = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-ngl") == 0) {
                if (i + 1 < argc) {
                    ngl = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else {
                print_usage(argc, argv);
                return 1;
            }
        } catch (std::exception & e) {
            fprintf(stderr, "error: %s\n", e.what());
            print_usage(argc, argv);
            return 1;
        }
    }
    if (model_path.empty()) {
        print_usage(argc, argv);
        return 1;
    }

    // only print errors
    llama_log_set([](enum ggml_log_level level, const char * text, void * /* user_data */) {
        if (level >= GGML_LOG_LEVEL_ERROR) {
            fprintf(stderr, "%s", text);
        }
    }, nullptr);

    // load dynamic backends
    ggml_backend_load_all();

    // initialize the model
    llama_model_params model_params = llama_model_default_params();
    model_params.n_gpu_layers = ngl;

    llama_model * model = llama_model_load_from_file(model_path.c_str(), model_params);
    if (!model) {
        fprintf(stderr , "%s: error: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context
    llama_context_params ctx_params = llama_context_default_params();
    ctx_params.n_ctx = n_ctx;
    ctx_params.n_batch = n_ctx;

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr , "%s: error: failed to create the llama_context\n" , __func__);
        return 1;
    }

    // initialize the sampler
    llama_sampler * smpl = llama_sampler_chain_init(llama_sampler_chain_default_params());
    llama_sampler_chain_add(smpl, llama_sampler_init_min_p(0.05f, 1));
    llama_sampler_chain_add(smpl, llama_sampler_init_temp(0.8f));
    llama_sampler_chain_add(smpl, llama_sampler_init_dist(LLAMA_DEFAULT_SEED));

    // helper function to evaluate a prompt and generate a response
    auto generate = [&](const std::string & prompt) {
        std::string response;

        const bool is_first = llama_kv_self_used_cells(ctx) == 0;

        // tokenize the prompt
        const int n_prompt_tokens = -llama_tokenize(vocab, prompt.c_str(), prompt.size(), NULL, 0, is_first, true);
        std::vector<llama_token> prompt_tokens(n_prompt_tokens);
        if (llama_tokenize(vocab, prompt.c_str(), prompt.size(), prompt_tokens.data(), prompt_tokens.size(), is_first, true) < 0) {
            GGML_ABORT("failed to tokenize the prompt\n");
        }

        // prepare a batch for the prompt
        llama_batch batch = llama_batch_get_one(prompt_tokens.data(), prompt_tokens.size());
        llama_token new_token_id;
        while (true) {
            // check if we have enough space in the context to evaluate this batch
            int n_ctx = llama_n_ctx(ctx);
            int n_ctx_used = llama_kv_self_used_cells(ctx);
            if (n_ctx_used + batch.n_tokens > n_ctx) {
                printf("\033[0m\n");
                fprintf(stderr, "context size exceeded\n");
                exit(0);
            }

            if (llama_decode(ctx, batch)) {
                GGML_ABORT("failed to decode\n");
            }

            // sample the next token
            new_token_id = llama_sampler_sample(smpl, ctx, -1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id)) {
                break;
            }

            // convert the token to a string, print it and add it to the response
            char buf[256];
            int n = llama_token_to_piece(vocab, new_token_id, buf, sizeof(buf), 0, true);
            if (n < 0) {
                GGML_ABORT("failed to convert token to piece\n");
            }
            std::string piece(buf, n);
            printf("%s", piece.c_str());
            fflush(stdout);
            response += piece;

            // prepare the next batch with the sampled token
            batch = llama_batch_get_one(&new_token_id, 1);
        }

        return response;
    };

    std::vector<llama_chat_message> messages;
    std::vector<char> formatted(llama_n_ctx(ctx));
    int prev_len = 0;
    while (true) {
        // get user input
        printf("\033[32m> \033[0m");
        std::string user;
        std::getline(std::cin, user);

        if (user.empty()) {
            break;
        }

        const char * tmpl = llama_model_chat_template(model, /* name */ nullptr);

        // add the user input to the message list and format it
        messages.push_back({"user", strdup(user.c_str())});
        int new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        if (new_len > (int)formatted.size()) {
            formatted.resize(new_len);
            new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        }
        if (new_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }

        // remove previous messages to obtain the prompt to generate the response
        std::string prompt(formatted.begin() + prev_len, formatted.begin() + new_len);

        // generate a response
        printf("\033[33m");
        std::string response = generate(prompt);
        printf("\n\033[0m");

        // add the response to the messages
        messages.push_back({"assistant", strdup(response.c_str())});
        prev_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), false, nullptr, 0);
        if (prev_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }
    }

    // free resources
    for (auto & msg : messages) {
        free(const_cast<char *>(msg.content));
    }
    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}